

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O2

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_polar<ExchCXX::BuiltinPW91_LDA_RPA>
               (double scal_fact,int N,const_host_buffer_type rho,host_buffer_type eps,
               host_buffer_type vxc)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  ulong uVar4;
  ulong uVar5;
  double e;
  double v_b;
  double v_a;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double dStack_50;
  double local_48;
  
  uVar4 = 0;
  uVar5 = (ulong)(uint)N;
  if (N < 1) {
    uVar5 = uVar4;
  }
  local_58 = scal_fact;
  dStack_50 = scal_fact;
  local_48 = scal_fact;
  for (; uVar5 * 8 != uVar4; uVar4 = uVar4 + 8) {
    lda_screening_interface<ExchCXX::BuiltinPW91_LDA_RPA>::eval_exc_vxc_polar
              (*(double *)((long)rho + uVar4 * 2),*(double *)((long)rho + uVar4 * 2 + 8),&local_70,
               &local_60,&local_68);
    *(double *)((long)eps + uVar4) = local_70 * local_48 + *(double *)((long)eps + uVar4);
    pdVar1 = (double *)((long)vxc + uVar4 * 2);
    dVar3 = pdVar1[1];
    pdVar2 = (double *)((long)vxc + uVar4 * 2);
    *pdVar2 = local_60 * local_58 + *pdVar1;
    pdVar2[1] = local_68 * dStack_50 + dVar3;
  }
  return;
}

Assistant:

LDA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto rho_i = rho + 2*i;
    auto vxc_i = vxc + 2*i;

    double v_a, v_b, e;
    traits::eval_exc_vxc_polar( rho_i[0], rho_i[1], e, v_a, v_b);
    eps[i]   += scal_fact * e;
    vxc_i[0] += scal_fact * v_a;
    vxc_i[1] += scal_fact * v_b;

  }

}